

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::computeRhoG
          (Projection *this,FArrayBox *rhoFab,FArrayBox *phiFab,Geometry *geom,Orientation *outFaces
          ,int numOutFlowFaces,Real gravity)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  BCRec *pBVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  int *lbc;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  long lVar29;
  double *pdVar30;
  bool bVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  int i;
  long lVar42;
  long lVar43;
  double *pdVar44;
  ulong uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  double dVar54;
  ulong in_XMM0_Qb;
  double dVar55;
  int hi_bc [3];
  int lo_bc [3];
  int local_60 [6];
  Real local_48;
  ulong uStack_40;
  
  if (0 < numOutFlowFaces) {
    dVar54 = -gravity;
    uStack_40 = in_XMM0_Qb ^ 0x8000000000000000;
    uVar45 = 0;
    local_48 = dVar54;
    do {
      iVar2 = outFaces[uVar45].val;
      if (iVar2 % 3 == 2) {
        if (2 < iVar2 - 3U) {
          amrex::Abort_host(
                           "Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort"
                           );
          dVar54 = local_48;
        }
      }
      else {
        iVar3 = phiFab[uVar45].super_BaseFab<double>.domain.smallend.vect[0];
        lVar32 = (long)iVar3;
        iVar4 = phiFab[uVar45].super_BaseFab<double>.domain.smallend.vect[1];
        lVar36 = (long)iVar4;
        iVar5 = phiFab[uVar45].super_BaseFab<double>.domain.smallend.vect[2];
        lVar12 = (long)iVar5;
        iVar21 = phiFab[uVar45].super_BaseFab<double>.domain.bigend.vect[0];
        iVar39 = phiFab[uVar45].super_BaseFab<double>.domain.bigend.vect[1];
        iVar6 = phiFab[uVar45].super_BaseFab<double>.domain.bigend.vect[2];
        lVar25 = (long)iVar6;
        pdVar28 = phiFab[uVar45].super_BaseFab<double>.dptr;
        iVar38 = iVar21 - iVar3;
        iVar24 = iVar39 - iVar4;
        lVar17 = (long)(iVar24 + 1);
        pdVar30 = rhoFab[uVar45].super_BaseFab<double>.dptr;
        uVar7 = rhoFab[uVar45].super_BaseFab<double>.domain.smallend.vect[0];
        lVar33 = (long)(int)uVar7;
        uVar8 = rhoFab[uVar45].super_BaseFab<double>.domain.smallend.vect[1];
        lVar37 = (long)(int)uVar8;
        lVar18 = (long)rhoFab[uVar45].super_BaseFab<double>.domain.smallend.vect[2];
        iVar13 = rhoFab[uVar45].super_BaseFab<double>.domain.bigend.vect[0];
        lVar15 = (long)(int)((rhoFab[uVar45].super_BaseFab<double>.domain.bigend.vect[1] - uVar8) +
                            1);
        dVar1 = (geom->super_CoordSys).dx[2];
        iVar23 = (geom->domain).smallend.vect[0];
        iVar14 = (geom->domain).smallend.vect[1];
        iVar9 = (geom->domain).bigend.vect[0];
        iVar10 = (geom->domain).bigend.vect[1];
        pBVar11 = this->phys_bc;
        lVar42 = 0;
        do {
          local_60[lVar42 + 3] = scalar_bc[pBVar11->bc[lVar42]];
          local_60[lVar42] = scalar_bc[pBVar11->bc[lVar42 + 3]];
          lVar42 = lVar42 + 1;
        } while (lVar42 != 3);
        lVar40 = (long)(iVar38 + 1);
        lVar42 = (long)(int)((iVar13 - uVar7) + 1);
        if (iVar2 % 3 == 0) {
          bVar31 = iVar4 == iVar14;
          bVar46 = local_60[4] == 3;
          bVar47 = iVar10 + 1 == iVar39;
          bVar48 = local_60[1] == 3;
          bVar49 = local_60[4] == 4;
          bVar50 = local_60[1] == 4;
          bVar51 = local_60[4] == 2;
          bVar52 = local_60[1] == 2;
          iVar13 = iVar4 + 1;
          iVar21 = iVar4;
          if (bVar31 && ((bVar46 || bVar49) || bVar51)) {
            iVar21 = iVar13;
          }
          bVar53 = bVar47 && ((bVar48 || bVar50) || bVar52);
          iVar14 = iVar39 + -1;
          iVar23 = iVar39;
          if (bVar47 && ((bVar48 || bVar50) || bVar52)) {
            iVar23 = iVar14;
          }
          if (iVar2 + 2U < 5) {
            if (iVar21 <= iVar23) {
              lVar19 = (long)(int)((iVar3 - uVar7) + 1);
              lVar26 = (long)iVar21;
              lVar41 = ((lVar25 + -1) - lVar18) * lVar15;
              iVar21 = ~uVar8 + iVar21;
              lVar29 = (lVar26 * 8 + lVar41 * 8 + lVar37 * -8) * lVar42;
              lVar34 = lVar29 + lVar19 * 8 + (long)pdVar30;
              lVar29 = lVar29 + lVar32 * 8 + lVar33 * -8 + (long)pdVar30;
              pdVar27 = (double *)
                        ((lVar26 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8 + lVar36 * -8) * lVar40
                        + (long)pdVar28);
              do {
                if (iVar5 < iVar6) {
                  lVar22 = (lVar41 * 8 + (long)iVar21 * 8) * lVar42;
                  dVar55 = 0.0;
                  lVar43 = 0;
                  lVar16 = lVar25;
                  pdVar35 = pdVar27;
                  do {
                    lVar16 = lVar16 + -1;
                    dVar55 = dVar55 + ((*(double *)(lVar29 + lVar43) +
                                       *(double *)
                                        ((long)pdVar30 + lVar43 + lVar22 + lVar32 * 8 + lVar33 * -8)
                                       ) * 0.5 * 3.0 +
                                      (*(double *)(lVar34 + lVar43) +
                                      *(double *)((long)pdVar30 + lVar43 + lVar22 + lVar19 * 8)) *
                                      -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar35 = *pdVar35 + dVar55;
                    lVar43 = lVar43 + lVar15 * lVar42 * -8;
                    pdVar35 = pdVar35 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar16);
                }
                lVar26 = lVar26 + 1;
                iVar21 = iVar21 + 1;
                lVar34 = lVar34 + lVar42 * 8;
                lVar29 = lVar29 + lVar42 * 8;
                pdVar27 = pdVar27 + lVar40;
              } while (iVar23 + 1 != (int)lVar26);
            }
            if (bVar31 && ((bVar46 || bVar49) || bVar51)) {
              if (bVar46 && bVar31) {
                if (iVar5 < iVar6) {
                  pdVar35 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar25 + -1) - lVar18) * lVar15 * 8) * lVar42 + (long)pdVar30);
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar36 = lVar25;
                  do {
                    lVar36 = lVar36 + -1;
                    dVar55 = dVar55 + (pdVar35[lVar32 - lVar33] * 3.0 -
                                      pdVar35[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    pdVar35 = pdVar35 + -(lVar15 * lVar42);
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar36);
                }
              }
              else if (bVar49 && bVar31) {
                if (iVar5 < iVar6) {
                  lVar19 = (long)(int)((iVar3 - uVar7) + 1);
                  lVar26 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar29 = ((long)iVar13 * 8 + lVar26 * 8 + lVar37 * -8) * lVar42;
                  lVar26 = (lVar36 * 8 + lVar26 * 8 + lVar37 * -8) * lVar42;
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  pdVar35 = pdVar30;
                  lVar36 = lVar25;
                  do {
                    lVar36 = lVar36 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar35 + lVar26 + lVar32 * 8 + lVar33 * -8) * 3.0 -
                                       *(double *)
                                        ((long)pdVar35 + lVar29 + lVar32 * 8 + lVar33 * -8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar35 + lVar26 + lVar19 * 8) * 3.0
                                             - *(double *)((long)pdVar35 + lVar29 + lVar19 * 8)) *
                                             -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    pdVar35 = pdVar35 + -(lVar15 * lVar42);
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar36);
                }
              }
              else if ((bVar51 && bVar31) && iVar5 < iVar6) {
                pdVar35 = (double *)
                          ((lVar36 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8) *
                           lVar42 + (long)pdVar30);
                pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                dVar55 = 0.0;
                lVar36 = lVar25;
                do {
                  lVar36 = lVar36 + -1;
                  dVar55 = dVar55 + (pdVar35[lVar32 - lVar33] * 3.0 -
                                    pdVar35[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar54 * dVar1;
                  *pdVar27 = *pdVar27 + dVar55;
                  pdVar35 = pdVar35 + -(lVar15 * lVar42);
                  pdVar27 = pdVar27 + -(lVar17 * lVar40);
                } while (lVar12 < lVar36);
              }
            }
            if (bVar53) {
              if (bVar48 && bVar47) {
                if (iVar5 < iVar6) {
                  pdVar30 = (double *)
                            ((long)pdVar30 +
                            ((long)iVar39 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8)
                            * lVar42);
                  pdVar28 = (double *)
                            ((long)pdVar28 +
                            ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + (pdVar30[lVar32 - lVar33] * 3.0 -
                                      pdVar30[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if (bVar50 && bVar47) {
                if (iVar5 < iVar6) {
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar36 = (long)(int)((iVar3 - uVar7) + 1);
                  lVar19 = ((long)(int)((iVar39 - uVar8) + -2) * 8 + lVar18 * 8) * lVar42;
                  lVar18 = ((long)iVar14 * 8 + lVar18 * 8 + lVar37 * -8) * lVar42;
                  pdVar28 = (double *)
                            ((long)pdVar28 +
                            ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar30 + lVar18 + lVar32 * 8 + lVar33 * -8) * 3.0 -
                                       *(double *)
                                        ((long)pdVar30 + lVar19 + lVar32 * 8 + lVar33 * -8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar30 + lVar18 + lVar36 * 8) * 3.0
                                             - *(double *)((long)pdVar30 + lVar19 + lVar36 * 8)) *
                                             -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if ((bVar52 && bVar47) && iVar5 < iVar6) {
                pdVar30 = (double *)
                          ((long)pdVar30 +
                          ((long)iVar14 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8) *
                          lVar42);
                pdVar28 = (double *)
                          ((long)pdVar28 +
                          ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                dVar55 = 0.0;
                do {
                  lVar25 = lVar25 + -1;
                  dVar55 = dVar55 + (pdVar30[lVar32 - lVar33] * 3.0 -
                                    pdVar30[(int)((iVar3 - uVar7) + 1)]) * 0.5 * dVar54 * dVar1;
                  *pdVar28 = *pdVar28 + dVar55;
                  pdVar30 = pdVar30 + -(lVar15 * lVar42);
                  pdVar28 = pdVar28 + -(lVar17 * lVar40);
                } while (lVar12 < lVar25);
              }
            }
          }
          else {
            if (iVar21 <= iVar23) {
              lVar19 = (long)(int)((iVar3 - uVar7) + -2);
              lVar26 = (long)iVar21;
              lVar29 = ((lVar25 + -1) - lVar18) * lVar15;
              iVar21 = ~uVar8 + iVar21;
              lVar33 = (lVar26 * 8 + lVar29 * 8 + lVar37 * -8) * lVar42;
              lVar32 = lVar33 + lVar19 * 8;
              lVar33 = lVar33 + (long)(int)(~uVar7 + iVar3) * 8;
              pdVar27 = (double *)
                        ((lVar26 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8 + lVar36 * -8) * lVar40
                        + (long)pdVar28);
              do {
                if (iVar5 < iVar6) {
                  lVar41 = (lVar29 * 8 + (long)iVar21 * 8) * lVar42;
                  dVar55 = 0.0;
                  lVar34 = lVar25;
                  pdVar35 = pdVar27;
                  pdVar44 = pdVar30;
                  do {
                    lVar34 = lVar34 + -1;
                    dVar55 = dVar55 + ((*(double *)((long)pdVar44 + lVar33) +
                                       *(double *)
                                        ((long)pdVar44 + lVar41 + (long)(int)(~uVar7 + iVar3) * 8))
                                       * 0.5 * 3.0 +
                                      (*(double *)((long)pdVar44 + lVar32) +
                                      *(double *)((long)pdVar44 + lVar19 * 8 + lVar41)) * -0.5) *
                                      0.5 * dVar54 * dVar1;
                    *pdVar35 = *pdVar35 + dVar55;
                    pdVar44 = pdVar44 + -(lVar15 * lVar42);
                    pdVar35 = pdVar35 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar34);
                }
                lVar26 = lVar26 + 1;
                iVar21 = iVar21 + 1;
                lVar32 = lVar32 + lVar42 * 8;
                lVar33 = lVar33 + lVar42 * 8;
                pdVar27 = pdVar27 + lVar40;
              } while (iVar23 + 1 != (int)lVar26);
            }
            if (bVar31 && ((bVar46 || bVar49) || bVar51)) {
              if (bVar46 && bVar31) {
                if (iVar5 < iVar6) {
                  pdVar35 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar25 + -1) - lVar18) * lVar15 * 8) * lVar42 + (long)pdVar30);
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + (pdVar35[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar35[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    pdVar35 = pdVar35 + -(lVar15 * lVar42);
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if (bVar49 && bVar31) {
                if (iVar5 < iVar6) {
                  lVar19 = (long)(int)((iVar3 - uVar7) + -2);
                  lVar32 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar26 = ((long)iVar13 * 8 + lVar32 * 8 + lVar37 * -8) * lVar42;
                  lVar33 = (lVar36 * 8 + lVar32 * 8 + lVar37 * -8) * lVar42;
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  pdVar35 = pdVar30;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar35 + lVar33 + (long)(int)(~uVar7 + iVar3) * 8)
                                        * 3.0 - *(double *)
                                                 ((long)pdVar35 +
                                                 lVar26 + (long)(int)(~uVar7 + iVar3) * 8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar35 + lVar33 + lVar19 * 8) * 3.0
                                             - *(double *)((long)pdVar35 + lVar26 + lVar19 * 8)) *
                                             -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    pdVar35 = pdVar35 + -(lVar15 * lVar42);
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if ((bVar51 && bVar31) && iVar5 < iVar6) {
                pdVar35 = (double *)
                          ((lVar36 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8) *
                           lVar42 + (long)pdVar30);
                pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                dVar55 = 0.0;
                lVar32 = lVar25;
                do {
                  lVar32 = lVar32 + -1;
                  dVar55 = dVar55 + (pdVar35[(int)(~uVar7 + iVar3)] * 3.0 -
                                    pdVar35[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar54 * dVar1;
                  *pdVar27 = *pdVar27 + dVar55;
                  pdVar35 = pdVar35 + -(lVar15 * lVar42);
                  pdVar27 = pdVar27 + -(lVar17 * lVar40);
                } while (lVar12 < lVar32);
              }
            }
            if (bVar53) {
              if (bVar48 && bVar47) {
                if (iVar5 < iVar6) {
                  pdVar30 = (double *)
                            ((long)pdVar30 +
                            ((long)iVar39 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8)
                            * lVar42);
                  pdVar28 = (double *)
                            ((long)pdVar28 +
                            ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + (pdVar30[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar30[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if (bVar50 && bVar47) {
                if (iVar5 < iVar6) {
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar33 = (long)(int)((iVar3 - uVar7) + -2);
                  lVar32 = ((long)(int)((iVar39 - uVar8) + -2) * 8 + lVar18 * 8) * lVar42;
                  lVar18 = ((long)iVar14 * 8 + lVar18 * 8 + lVar37 * -8) * lVar42;
                  pdVar28 = (double *)
                            ((long)pdVar28 +
                            ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar30 + lVar18 + (long)(int)(~uVar7 + iVar3) * 8)
                                        * 3.0 - *(double *)
                                                 ((long)pdVar30 +
                                                 lVar32 + (long)(int)(~uVar7 + iVar3) * 8)) * 0.5 *
                                       3.0 + (*(double *)((long)pdVar30 + lVar18 + lVar33 * 8) * 3.0
                                             - *(double *)((long)pdVar30 + lVar32 + lVar33 * 8)) *
                                             -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if ((bVar52 && bVar47) && iVar5 < iVar6) {
                pdVar30 = (double *)
                          ((long)pdVar30 +
                          ((long)iVar14 * 8 + ((lVar25 + -1) - lVar18) * lVar15 * 8 + lVar37 * -8) *
                          lVar42);
                pdVar28 = (double *)
                          ((long)pdVar28 +
                          ((long)iVar24 * 8 + ((lVar25 + -1) - lVar12) * lVar17 * 8) * lVar40);
                dVar55 = 0.0;
                do {
                  lVar25 = lVar25 + -1;
                  dVar55 = dVar55 + (pdVar30[(int)(~uVar7 + iVar3)] * 3.0 -
                                    pdVar30[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar54 * dVar1;
                  *pdVar28 = *pdVar28 + dVar55;
                  pdVar30 = pdVar30 + -(lVar15 * lVar42);
                  pdVar28 = pdVar28 + -(lVar17 * lVar40);
                } while (lVar12 < lVar25);
              }
            }
          }
        }
        else {
          bVar46 = iVar3 == iVar23;
          bVar47 = local_60[3] == 3;
          bVar48 = iVar9 + 1 == iVar21;
          bVar49 = local_60[0] == 3;
          bVar50 = local_60[3] == 4;
          bVar51 = local_60[0] == 4;
          bVar52 = local_60[3] == 2;
          bVar53 = local_60[0] == 2;
          bVar31 = bVar46 && ((bVar47 || bVar50) || bVar52);
          iVar13 = iVar3 + 1;
          iVar39 = iVar3;
          if (bVar46 && ((bVar47 || bVar50) || bVar52)) {
            iVar39 = iVar13;
          }
          bVar20 = bVar48 && ((bVar49 || bVar51) || bVar53);
          iVar14 = iVar21 + -1;
          iVar23 = iVar21;
          if (bVar48 && ((bVar49 || bVar51) || bVar53)) {
            iVar23 = iVar14;
          }
          if (iVar2 + 2U < 5) {
            if (iVar39 <= iVar23) {
              lVar29 = (long)iVar39;
              lVar26 = ((lVar25 + -1) - lVar18) * lVar15;
              lVar19 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar26 * 8) * lVar42;
              iVar39 = ~uVar7 + iVar39;
              lVar26 = (lVar36 * 8 + lVar26 * 8 + lVar37 * -8) * lVar42;
              lVar41 = lVar19 + lVar29 * 8 + lVar33 * -8 + (long)pdVar30;
              lVar34 = lVar26 + lVar29 * 8 + lVar33 * -8 + (long)pdVar30;
              pdVar27 = pdVar28 + ((((lVar25 + -1) - lVar12) * lVar17 * lVar40 + lVar29) - lVar32);
              do {
                if (iVar5 < iVar6) {
                  dVar55 = 0.0;
                  lVar22 = 0;
                  lVar16 = lVar25;
                  pdVar35 = pdVar27;
                  do {
                    lVar16 = lVar16 + -1;
                    dVar55 = dVar55 + ((*(double *)(lVar34 + lVar22) +
                                       *(double *)
                                        ((long)pdVar30 + lVar22 + (long)iVar39 * 8 + lVar26)) * 0.5
                                       * 3.0 + (*(double *)(lVar41 + lVar22) +
                                               *(double *)
                                                ((long)pdVar30 + lVar22 + (long)iVar39 * 8 + lVar19)
                                               ) * -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar35 = *pdVar35 + dVar55;
                    lVar22 = lVar22 + lVar15 * lVar42 * -8;
                    pdVar35 = pdVar35 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar16);
                }
                lVar29 = lVar29 + 1;
                iVar39 = iVar39 + 1;
                lVar41 = lVar41 + 8;
                lVar34 = lVar34 + 8;
                pdVar27 = pdVar27 + 1;
              } while (iVar23 + 1 != (int)lVar29);
            }
            if (bVar31) {
              if (bVar47 && bVar46) {
                if (iVar5 < iVar6) {
                  lVar19 = ((lVar25 + -1) - lVar18) * lVar15;
                  pdVar27 = pdVar30 + (int)(~uVar7 + iVar3);
                  pdVar35 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + (*(double *)
                                        ((long)pdVar27 +
                                        (lVar36 * 8 + lVar19 * 8 + lVar37 * -8) * lVar42) * 3.0 -
                                      *(double *)
                                       ((long)pdVar27 +
                                       ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar19 * 8) * lVar42)
                                      ) * 0.5 * dVar54 * dVar1;
                    *pdVar35 = *pdVar35 + dVar55;
                    pdVar27 = pdVar27 + -(lVar15 * lVar42);
                    pdVar35 = pdVar35 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if (bVar50 && bVar46) {
                if (iVar5 < iVar6) {
                  lVar26 = lVar33 * -8;
                  lVar29 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar19 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar29 * 8) * lVar42;
                  lVar34 = lVar19 + (long)iVar13 * 8 + (long)pdVar30;
                  lVar41 = lVar15 * lVar42 * -8;
                  lVar16 = lVar19 + lVar32 * 8 + (long)pdVar30;
                  lVar19 = (lVar36 * 8 + lVar29 * 8 + lVar37 * -8) * lVar42;
                  lVar29 = lVar19 + (long)iVar13 * 8 + (long)pdVar30;
                  lVar19 = lVar19 + lVar32 * 8 + (long)pdVar30;
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + ((*(double *)(lVar19 + lVar26) * 3.0 -
                                       *(double *)(lVar29 + lVar26)) * 0.5 * 3.0 +
                                      (*(double *)(lVar16 + lVar26) * 3.0 -
                                      *(double *)(lVar34 + lVar26)) * -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    lVar34 = lVar34 + lVar41;
                    lVar16 = lVar16 + lVar41;
                    lVar29 = lVar29 + lVar41;
                    lVar19 = lVar19 + lVar41;
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if ((bVar52 && bVar46) && iVar5 < iVar6) {
                lVar19 = ((lVar25 + -1) - lVar18) * lVar15;
                pdVar35 = pdVar30 + (lVar32 - lVar33);
                pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                dVar55 = 0.0;
                lVar32 = lVar25;
                do {
                  lVar32 = lVar32 + -1;
                  dVar55 = dVar55 + (*(double *)
                                      ((long)pdVar35 +
                                      (lVar36 * 8 + lVar19 * 8 + lVar37 * -8) * lVar42) * 3.0 -
                                    *(double *)
                                     ((long)pdVar35 +
                                     ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar19 * 8) * lVar42))
                                    * 0.5 * dVar54 * dVar1;
                  *pdVar27 = *pdVar27 + dVar55;
                  pdVar35 = pdVar35 + -(lVar15 * lVar42);
                  pdVar27 = pdVar27 + -(lVar17 * lVar40);
                } while (lVar12 < lVar32);
              }
            }
            if (bVar20) {
              if (bVar49 && bVar48) {
                if (iVar5 < iVar6) {
                  pdVar30 = pdVar30 + (iVar21 - lVar33);
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + (*(double *)
                                        ((long)pdVar30 +
                                        (lVar18 * 8 + lVar36 * 8 + lVar37 * -8) * lVar42) * 3.0 -
                                      *(double *)
                                       ((long)pdVar30 +
                                       ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar18 * 8) * lVar42)
                                      ) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if (bVar51 && bVar48) {
                if (iVar5 < iVar6) {
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar19 = (long)(int)((iVar21 - uVar7) + -2);
                  lVar32 = ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar18 * 8) * lVar42;
                  lVar18 = (lVar36 * 8 + lVar18 * 8 + lVar37 * -8) * lVar42;
                  pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar30 + lVar18 + (long)iVar14 * 8 + lVar33 * -8) *
                                        3.0 - *(double *)((long)pdVar30 + lVar18 + lVar19 * 8)) *
                                       0.5 * 3.0 +
                                      (*(double *)
                                        ((long)pdVar30 + lVar32 + (long)iVar14 * 8 + lVar33 * -8) *
                                       3.0 - *(double *)((long)pdVar30 + lVar32 + lVar19 * 8)) *
                                      -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if ((bVar53 && bVar48) && iVar5 < iVar6) {
                pdVar30 = pdVar30 + (iVar14 - lVar33);
                lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                dVar55 = 0.0;
                do {
                  lVar25 = lVar25 + -1;
                  dVar55 = dVar55 + (*(double *)
                                      ((long)pdVar30 +
                                      (lVar36 * 8 + lVar18 * 8 + lVar37 * -8) * lVar42) * 3.0 -
                                    *(double *)
                                     ((long)pdVar30 +
                                     ((long)(int)((iVar4 - uVar8) + 1) * 8 + lVar18 * 8) * lVar42))
                                    * 0.5 * dVar54 * dVar1;
                  *pdVar28 = *pdVar28 + dVar55;
                  pdVar30 = pdVar30 + -(lVar15 * lVar42);
                  pdVar28 = pdVar28 + -(lVar17 * lVar40);
                } while (lVar12 < lVar25);
              }
            }
          }
          else {
            if (iVar39 <= iVar23) {
              lVar37 = (long)iVar39;
              lVar26 = ((lVar25 + -1) - lVar18) * lVar15;
              iVar39 = ~uVar7 + iVar39;
              lVar36 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar26 * 8) * lVar42;
              lVar19 = lVar36 + lVar37 * 8 + lVar33 * -8 + (long)pdVar30;
              pdVar27 = pdVar28 + ((((lVar25 + -1) - lVar12) * lVar17 * lVar40 + lVar37) - lVar32);
              do {
                if (iVar5 < iVar6) {
                  dVar55 = 0.0;
                  lVar34 = 0;
                  lVar29 = lVar25;
                  pdVar35 = pdVar27;
                  do {
                    lVar29 = lVar29 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar30 + lVar34 + (long)iVar39 * 8 + lVar36) +
                                       *(double *)(lVar19 + lVar34)) * 0.5 * 3.0 +
                                      (*(double *)(lVar19 + lVar34) +
                                      *(double *)
                                       ((long)pdVar30 +
                                       lVar34 + (long)iVar39 * 8 +
                                                ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar26 * 8)
                                                * lVar42)) * -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar35 = *pdVar35 + dVar55;
                    lVar34 = lVar34 + lVar15 * lVar42 * -8;
                    pdVar35 = pdVar35 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar29);
                }
                lVar37 = lVar37 + 1;
                iVar39 = iVar39 + 1;
                lVar19 = lVar19 + 8;
                pdVar27 = pdVar27 + 1;
              } while (iVar23 + 1 != (int)lVar37);
            }
            if (bVar31) {
              if (bVar47 && bVar46) {
                if (iVar5 < iVar6) {
                  pdVar35 = (double *)
                            (((long)(int)(~uVar8 + iVar4) * 8 +
                             ((lVar25 + -1) - lVar18) * lVar15 * 8) * lVar42 + (long)pdVar30);
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + (pdVar35[(int)(~uVar7 + iVar3)] * 3.0 -
                                      pdVar35[(int)((iVar3 - uVar7) + -2)]) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    pdVar35 = pdVar35 + -(lVar15 * lVar42);
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if (bVar50 && bVar46) {
                if (iVar5 < iVar6) {
                  lVar37 = lVar33 * -8;
                  lVar34 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar36 = ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar34 * 8) * lVar42;
                  lVar19 = lVar36 + (long)iVar13 * 8 + (long)pdVar30;
                  lVar26 = lVar15 * lVar42 * -8;
                  lVar29 = lVar36 + lVar32 * 8 + (long)pdVar30;
                  lVar36 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar34 * 8) * lVar42;
                  lVar34 = lVar36 + (long)iVar13 * 8 + (long)pdVar30;
                  lVar36 = lVar36 + lVar32 * 8 + (long)pdVar30;
                  pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                  dVar55 = 0.0;
                  lVar32 = lVar25;
                  do {
                    lVar32 = lVar32 + -1;
                    dVar55 = dVar55 + ((*(double *)(lVar36 + lVar37) * 3.0 -
                                       *(double *)(lVar34 + lVar37)) * 0.5 * 3.0 +
                                      (*(double *)(lVar29 + lVar37) * 3.0 -
                                      *(double *)(lVar19 + lVar37)) * -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar27 = *pdVar27 + dVar55;
                    lVar19 = lVar19 + lVar26;
                    lVar29 = lVar29 + lVar26;
                    lVar34 = lVar34 + lVar26;
                    lVar36 = lVar36 + lVar26;
                    pdVar27 = pdVar27 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar32);
                }
              }
              else if ((bVar52 && bVar46) && iVar5 < iVar6) {
                lVar36 = ((lVar25 + -1) - lVar18) * lVar15;
                pdVar35 = pdVar30 + (lVar32 - lVar33);
                pdVar27 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40;
                dVar55 = 0.0;
                lVar32 = lVar25;
                do {
                  lVar32 = lVar32 + -1;
                  dVar55 = dVar55 + (*(double *)
                                      ((long)pdVar35 +
                                      ((long)(int)(~uVar8 + iVar4) * 8 + lVar36 * 8) * lVar42) * 3.0
                                    - *(double *)
                                       ((long)pdVar35 +
                                       ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar36 * 8) * lVar42
                                       )) * 0.5 * dVar54 * dVar1;
                  *pdVar27 = *pdVar27 + dVar55;
                  pdVar35 = pdVar35 + -(lVar15 * lVar42);
                  pdVar27 = pdVar27 + -(lVar17 * lVar40);
                } while (lVar12 < lVar32);
              }
            }
            if (bVar20) {
              if (bVar49 && bVar48) {
                if (iVar5 < iVar6) {
                  pdVar30 = pdVar30 + (iVar21 - lVar33);
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + (*(double *)
                                        ((long)pdVar30 +
                                        ((long)(int)(~uVar8 + iVar4) * 8 + lVar18 * 8) * lVar42) *
                                       3.0 - *(double *)
                                              ((long)pdVar30 +
                                              ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar18 * 8) *
                                              lVar42)) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if (bVar51 && bVar48) {
                if (iVar5 < iVar6) {
                  lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                  lVar36 = (long)(int)((iVar21 - uVar7) + -2);
                  lVar32 = ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar18 * 8) * lVar42;
                  lVar18 = ((long)(int)(~uVar8 + iVar4) * 8 + lVar18 * 8) * lVar42;
                  pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                  dVar55 = 0.0;
                  do {
                    lVar25 = lVar25 + -1;
                    dVar55 = dVar55 + ((*(double *)
                                         ((long)pdVar30 + lVar18 + (long)iVar14 * 8 + lVar33 * -8) *
                                        3.0 - *(double *)((long)pdVar30 + lVar18 + lVar36 * 8)) *
                                       0.5 * 3.0 +
                                      (*(double *)
                                        ((long)pdVar30 + lVar32 + (long)iVar14 * 8 + lVar33 * -8) *
                                       3.0 - *(double *)((long)pdVar30 + lVar32 + lVar36 * 8)) *
                                      -0.5) * 0.5 * dVar54 * dVar1;
                    *pdVar28 = *pdVar28 + dVar55;
                    pdVar30 = pdVar30 + -(lVar15 * lVar42);
                    pdVar28 = pdVar28 + -(lVar17 * lVar40);
                  } while (lVar12 < lVar25);
                }
              }
              else if ((bVar53 && bVar48) && iVar5 < iVar6) {
                pdVar30 = pdVar30 + (iVar14 - lVar33);
                lVar18 = ((lVar25 + -1) - lVar18) * lVar15;
                pdVar28 = pdVar28 + ((lVar25 + -1) - lVar12) * lVar17 * lVar40 + (long)iVar38;
                dVar55 = 0.0;
                do {
                  lVar25 = lVar25 + -1;
                  dVar55 = dVar55 + (*(double *)
                                      ((long)pdVar30 +
                                      ((long)(int)(~uVar8 + iVar4) * 8 + lVar18 * 8) * lVar42) * 3.0
                                    - *(double *)
                                       ((long)pdVar30 +
                                       ((long)(int)((iVar4 - uVar8) + -2) * 8 + lVar18 * 8) * lVar42
                                       )) * 0.5 * dVar54 * dVar1;
                  *pdVar28 = *pdVar28 + dVar55;
                  pdVar30 = pdVar30 + -(lVar15 * lVar42);
                  pdVar28 = pdVar28 + -(lVar17 * lVar40);
                } while (lVar12 < lVar25);
              }
            }
          }
        }
      }
      uVar45 = uVar45 + 1;
    } while (uVar45 != (uint)numOutFlowFaces);
  }
  return;
}

Assistant:

void
Projection::computeRhoG(FArrayBox*         rhoFab,
			FArrayBox*         phiFab,
			const Geometry&    geom,
			Orientation*       outFaces,
			int                numOutFlowFaces,
			Real               gravity)
{
    AMREX_ASSERT(std::fabs(gravity) > 0.);

    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
      int outDir             = outFaces[iface].coordDir();
      Orientation::Side side = outFaces[iface].faceDir();

      if (outDir == (AMREX_SPACEDIM-1))
      {
	  if (side == Orientation::high) {
	    //
	    // Hydrostatic pressure == 0 here, given IAMR definition of gravity.
	    // Do nothing, since phi already initialized to zero
	    //
	  } else {
	    amrex::Abort("Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort");
	  }
      }
      else // integrate rho * g* dh
      {
	  const auto   lo = amrex::lbound(phiFab[iface].box());
	  const auto   hi = amrex::ubound(phiFab[iface].box());
	  const auto& phi = phiFab[iface].array();
	  const auto& rho = rhoFab[iface].array();
	  const Real dh = geom.CellSize(AMREX_SPACEDIM-1);

	  auto add_rhog = [gravity, dh] ( Real rho1, Real rho2,
					  Real& rhog_i, Real& phi_i )
	  {
	    Real rhoExt = 0.5*(3.*rho1-rho2);
	    rhog_i -= gravity * rhoExt * dh;
	    phi_i  += rhog_i;
	  };


#if (AMREX_SPACEDIM == 2)
	  //
	  // Only possibilities are XLO face or XHI
	  //
	  // Ok to only use low index of phi because phi is only one
	  // node wide in i-direction.
	  //
	  AMREX_ASSERT( lo.x==hi.x );
	  int i = lo.x;

	  Real rhog = 0.;
	  //
	  // Note that the integral here prevents parallelization
	  //
	  if (side == Orientation::low)
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i,j,0),rho(i+1,j,0),rhog,phi(i,j,0));
	    }
	  }
	  else
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i-1,j,0),rho(i-2,j,0),rhog,phi(i,j,0));
	    }
	  }
#else
	  const Box& domain = geom.Domain();
	  const auto domlo = amrex::lbound(domain);
	  const auto domhi = amrex::ubound(domain);

	  // fixme? Could make use of NSB::m_bcrec_scalars here.
	  int        lo_bc[AMREX_SPACEDIM];
	  int        hi_bc[AMREX_SPACEDIM];
	  //
	  // change from phys_bcs of Inflow, SlipWall, etc.
	  // to mathematical bcs of EXT_DIR, FOEXTRAP, etc.
	  //
	  for (int i = 0; i < AMREX_SPACEDIM; i++)
	  {
	      const int* lbc = phys_bc->lo();
	      const int* hbc = phys_bc->hi();

	      lo_bc[i]=scalar_bc[lbc[i]];
	      hi_bc[i]=scalar_bc[hbc[i]];
	  }

	  //
	  // fixme? - TODO: Could parallelize here by dividing the loop over i (or j)
	  // only and thus the k integration stays intact. However, would want to move
	  // this declaration of rho_i, rho_ii to ensure each k integration has it's own
	  // copy.
	  //
	  Real rho_i, rho_ii;

	  if ( outDir == int(Direction::x) )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.x==hi.x );
	      int i = lo.x;

	      bool has_extdir_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::foextrap);

	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over j accordingly.
	      //
	      int jlo, jhi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		jlo = lo.y+1;
	      } else {
		jlo = lo.y;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		jhi = hi.y-1;
	      } else {
		jhi = hi.y;
	      }

	      //
	      // xlo face
	      //
	      if (side == Orientation::low)
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i  = 0.5 * (rho(i  ,j,k) + rho(i  ,j-1,k));
		    rho_ii = 0.5 * (rho(i+1,j,k) + rho(i+1,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j,k) - rho(i  ,j+1,k));
		      rho_ii = 0.5*(3.*rho(i+1,j,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j-1,k) - rho(i  ,j-2,k));
		      rho_ii = 0.5*(3.*rho(i+1,j-1,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // xhi face
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i-1,j,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i-2,j,k) + rho(i-2,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j,k) - rho(i-1,j+1,k));
		      rho_ii = 0.5*(3.*rho(i-2,j,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-1,j-2,k));
		      rho_ii = 0.5*(3.*rho(i-2,j-1,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	  }
	  else // ( outDir == Direction::y )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.y==hi.y );
	      int j = lo.y;

	      bool has_extdir_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::foextrap);
	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over i accordingly.
	      //
	      int ilo, ihi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		ilo = lo.x+1;
	      } else {
		ilo = lo.x;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		ihi = hi.x-1;
	      } else {
		ihi = hi.x;
	      }
	      //
	      // ylo face
	      //
	      if (side == Orientation::low)
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j  ,k) + rho(i-1,j ,k));
		    rho_ii = 0.5 * (rho(i,j+1,k) + rho(i-1,j+1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute x-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j  ,k) - rho(i+1,j  ,k));
		      rho_ii = 0.5*(3.*rho(i,j+1,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j  ,k) - rho(i-2,j  ,k));
		      rho_ii = 0.5*(3.*rho(i-1,j+1,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // yhi face
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j-1,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i,j-1,k) + rho(i-1,j-2,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j-1,k) - rho(i+1,j-1,k));
		      rho_ii = 0.5*(3.*rho(i,j-2,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-2,j-1,k));
		      rho_ii = 0.5*(3.*rho(i-1,j-2,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-1,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      } // endif over hi/low sides
	  } // endif over directions
#endif
      } // endif integrate rho*g*dh
    } // end loop over outflow faces
}